

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_componentNotEqualByVariable_Test::Equality_componentNotEqualByVariable_Test
          (Equality_componentNotEqualByVariable_Test *this)

{
  Equality_componentNotEqualByVariable_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Equality_componentNotEqualByVariable_Test_0014a4b0;
  return;
}

Assistant:

TEST(Equality, componentNotEqualByVariable)
{
    libcellml::ComponentPtr c1 = libcellml::Component::create("c");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c");

    libcellml::VariablePtr v1 = libcellml::Variable::create("vA");
    libcellml::VariablePtr v2 = libcellml::Variable::create("vB");

    c1->addVariable(v1);
    c2->addVariable(v2);

    EXPECT_FALSE(c1->equals(c2));
    EXPECT_FALSE(c2->equals(c1));
}